

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlxContext.cpp
# Opt level: O1

void __thiscall sf::priv::GlxContext::updateSettingsFromWindow(GlxContext *this)

{
  int iVar1;
  XVisualInfo *visualInfo;
  ostream *poVar2;
  int nbVisuals;
  XVisualInfo tpl;
  XWindowAttributes windowAttributes;
  undefined1 local_d8 [8];
  undefined8 local_d0;
  undefined4 local_c8;
  undefined1 local_98 [24];
  undefined8 local_80;
  
  iVar1 = XGetWindowAttributes(this->m_display,this->m_window,local_98);
  if (iVar1 == 0) {
    poVar2 = err();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,"Failed to get the window attributes",0x23);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  else {
    local_c8 = *(undefined4 *)(this->m_display + 0xe0);
    local_d0 = XVisualIDFromVisual(local_80);
    visualInfo = (XVisualInfo *)XGetVisualInfo(this->m_display,3,local_d8);
    if (visualInfo != (XVisualInfo *)0x0) {
      updateSettingsFromVisualInfo(this,visualInfo);
      XFree(visualInfo);
    }
  }
  return;
}

Assistant:

void GlxContext::updateSettingsFromWindow()
{
    // Retrieve the attributes of the target window
    XWindowAttributes windowAttributes;
    if (XGetWindowAttributes(m_display, m_window, &windowAttributes) == 0)
    {
        err() << "Failed to get the window attributes" << std::endl;
        return;
    }

    // Get its visuals
    XVisualInfo tpl;
    tpl.screen   = DefaultScreen(m_display);
    tpl.visualid = XVisualIDFromVisual(windowAttributes.visual);
    int nbVisuals = 0;
    XVisualInfo* visualInfo = XGetVisualInfo(m_display, VisualIDMask | VisualScreenMask, &tpl, &nbVisuals);

    if (!visualInfo)
        return;

    updateSettingsFromVisualInfo(visualInfo);

    XFree(visualInfo);
}